

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_check_pubkey(mbedtls_rsa_context *ctx)

{
  int iVar1;
  size_t sVar2;
  mbedtls_rsa_context *ctx_local;
  
  if ((((((ctx->N).p != (mbedtls_mpi_uint *)0x0) && ((ctx->E).p != (mbedtls_mpi_uint *)0x0)) &&
       ((*(ctx->N).p & 1) != 0)) &&
      (((*(ctx->E).p & 1) != 0 && (sVar2 = mbedtls_mpi_bitlen(&ctx->N), 0x7f < sVar2)))) &&
     (sVar2 = mbedtls_mpi_bitlen(&ctx->N), sVar2 < 0x2001)) {
    sVar2 = mbedtls_mpi_bitlen(&ctx->E);
    if ((1 < sVar2) && (iVar1 = mbedtls_mpi_cmp_mpi(&ctx->E,&ctx->N), iVar1 < 0)) {
      return 0;
    }
    return -0x4200;
  }
  return -0x4200;
}

Assistant:

int mbedtls_rsa_check_pubkey( const mbedtls_rsa_context *ctx )
{
    if( !ctx->N.p || !ctx->E.p )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( ( ctx->N.p[0] & 1 ) == 0 ||
        ( ctx->E.p[0] & 1 ) == 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->N ) < 128 ||
        mbedtls_mpi_bitlen( &ctx->N ) > MBEDTLS_MPI_MAX_BITS )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    if( mbedtls_mpi_bitlen( &ctx->E ) < 2 ||
        mbedtls_mpi_cmp_mpi( &ctx->E, &ctx->N ) >= 0 )
        return( MBEDTLS_ERR_RSA_KEY_CHECK_FAILED );

    return( 0 );
}